

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O0

void __thiscall ser::MetainfoSet::AddNode(MetainfoSet *this,JSONNode *node)

{
  json_string *__return_storage_ptr__;
  uchar uVar1;
  ostream *poVar2;
  SerializationException *this_00;
  string local_2c0;
  json_string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss;
  undefined1 local_108 [8];
  SerializationException exception;
  int local_bc;
  json_string local_b8;
  json_string local_98;
  json_string local_78;
  bool local_41;
  json_string local_40;
  double local_20;
  double r;
  JSONNode *node_local;
  MetainfoSet *this_local;
  
  r = (double)node;
  node_local = (JSONNode *)this;
  uVar1 = ::JSONNode::type(node);
  if (uVar1 == '\x01') {
    ::JSONNode::name_abi_cxx11_(&local_78,(JSONNode *)r);
    ::JSONNode::as_string_abi_cxx11_(&local_98,(JSONNode *)r);
    AddMetainfo<std::__cxx11::string>(this,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else if (uVar1 == '\x02') {
    local_20 = ::JSONNode::as_float((JSONNode *)r);
    if ((local_20 != (double)(int)local_20) || (NAN(local_20) || NAN((double)(int)local_20))) {
      __return_storage_ptr__ = (json_string *)((long)&exception.message_.field_2 + 8);
      ::JSONNode::name_abi_cxx11_(__return_storage_ptr__,(JSONNode *)r);
      AddMetainfo<double>(this,__return_storage_ptr__,&local_20);
      std::__cxx11::string::~string((string *)(exception.message_.field_2._M_local_buf + 8));
    }
    else {
      ::JSONNode::name_abi_cxx11_(&local_b8,(JSONNode *)r);
      local_bc = (int)local_20;
      AddMetainfo<int>(this,&local_b8,&local_bc);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  else {
    if (uVar1 != '\x03') {
      SerializationException::SerializationException((SerializationException *)local_108);
      std::__cxx11::ostringstream::ostringstream(local_280);
      poVar2 = std::operator<<((ostream *)local_280,
                               "Error: JSON node has wrong type and could not be parsed:\n");
      ::JSONNode::write_formatted_abi_cxx11_(&local_2a0,(JSONNode *)r,0x800);
      poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::~string((string *)&local_2a0);
      std::__cxx11::ostringstream::str();
      SerializationException::Init((SerializationException *)local_108,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      this_00 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(this_00,(SerializationException *)local_108);
      __cxa_throw(this_00,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    ::JSONNode::name_abi_cxx11_(&local_40,(JSONNode *)r);
    local_41 = ::JSONNode::as_bool((JSONNode *)r);
    AddMetainfo<bool>(this,&local_40,&local_41);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void MetainfoSet::AddNode(const JSONNode& node)
{
    JSON_NUMBER_TYPE r;
    switch (node.type())
    {
    case JSON_BOOL:
        return AddMetainfo(node.name(), node.as_bool());
    case JSON_STRING:
        return AddMetainfo(node.name(), node.as_string());
    case JSON_NUMBER:
        r = node.as_float();
        if (r == static_cast<JSON_NUMBER_TYPE>(static_cast<int>(r)))
            return AddMetainfo(node.name(), static_cast<int>(r));
        else
            return AddMetainfo(node.name(), r);
    default:
        break;
    }

    SerializationException exception;
    std::ostringstream ss;
    ss << "Error: JSON node has wrong type and could not be parsed:\n" << node.write_formatted() << "\n";
    exception.Init(ss.str());
    throw exception;
}